

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<signed_char,short>(uint length,char value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int i;
  void *__s;
  ulong uVar2;
  undefined8 *puVar3;
  long lVar4;
  shared_ptr<signed_char> pt;
  shared_ptr<short> pu;
  
  __s = operator_new__((long)(int)length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,__s,nosimd::common::free<signed_char>
            );
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar2 = (long)(int)length * 2;
  }
  pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<short>);
  _Var1._M_pi = pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (0 < (int)length) {
    memset(__s,(uint)(byte)value,(ulong)length);
    uVar2 = 0;
    do {
      *(short *)((long)&(_Var1._M_pi)->_vptr__Sp_counted_base + uVar2 * 2) =
           (short)*(char *)((long)__s + uVar2);
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if (*(short *)((long)&(_Var1._M_pi)->_vptr__Sp_counted_base + lVar4 * 2) != (short)value) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = signed char, _U = short]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (pu.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}